

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

string * __thiscall
absl::strings_internal::CatPieces_abi_cxx11_
          (string *__return_storage_ptr__,strings_internal *this,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  size_t __n;
  long lVar1;
  pointer pcVar2;
  iterator pbVar3;
  long lVar4;
  size_t this_size;
  pointer __dest;
  
  pbVar3 = pieces._M_array;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (pbVar3 == (iterator)0x0) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,'\0');
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    __dest = pcVar2;
  }
  else {
    lVar1 = 0;
    lVar4 = 0;
    do {
      lVar4 = lVar4 + *(long *)(this + lVar1);
      lVar1 = lVar1 + 0x10;
    } while ((long)pbVar3 << 4 != lVar1);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar4);
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    __dest = pcVar2;
    if (pbVar3 != (iterator)0x0) {
      lVar1 = 0;
      do {
        __n = *(size_t *)(this + lVar1);
        if (__n != 0) {
          memcpy(__dest,*(void **)(this + lVar1 + 8),__n);
          __dest = __dest + __n;
        }
        lVar1 = lVar1 + 0x10;
      } while ((long)pbVar3 << 4 != lVar1);
    }
  }
  if (__dest != pcVar2 + __return_storage_ptr__->_M_string_length) {
    __assert_fail("out == begin + result.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/str_cat.cc"
                  ,0x95,
                  "std::string absl::strings_internal::CatPieces(std::initializer_list<absl::string_view>)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CatPieces(std::initializer_list<absl::string_view> pieces) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  uint64_t total_size = 0;
  for (absl::string_view piece : pieces) {
    total_size += piece.size();
  }
  ABSL_INTERNAL_CHECK(total_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(total_size));

  char* const begin = &result[0];
  char* out = begin;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + result.size());
  return result;
}